

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_user.cpp
# Opt level: O3

AWeapon * __thiscall APlayerPawn::BestWeapon(APlayerPawn *this,PClassAmmo *ammotype)

{
  byte bVar1;
  AWeapon *pAVar2;
  TObjPtr<AAmmo> TVar3;
  TObjPtr<AWeapon> TVar4;
  AStateProvider *pAVar5;
  PClass *pPVar6;
  AInventory *pAVar7;
  PClass *pPVar8;
  PClassAmmo *pPVar9;
  AWeapon *this_00;
  int iVar10;
  AWeapon *pAVar11;
  bool bVar12;
  
  pAVar7 = AActor::FindInventory
                     (&this->super_AActor,
                      (PClassActor *)APowerWeaponLevel2::RegistrationInfo.MyClass,true);
  pAVar2 = (AWeapon *)(this->super_AActor).Inventory.field_0.p;
  if (pAVar2 == (AWeapon *)0x0) {
    pAVar11 = (AWeapon *)0x0;
  }
  else {
    if ((*(byte *)((long)&(pAVar2->super_AStateProvider).super_AInventory.super_AActor.
                          super_DThinker.super_DObject + 0x20) & 0x20) == 0) {
      iVar10 = 0x7fffffff;
      pAVar11 = (AWeapon *)0x0;
      do {
        this_00 = pAVar2;
        pPVar6 = AWeapon::RegistrationInfo.MyClass;
        pPVar8 = *(PClass **)((long)&(this_00->super_AStateProvider).super_AInventory + 8);
        if (pPVar8 == (PClass *)0x0) {
          pPVar8 = (PClass *)
                   (*(code *)**(undefined8 **)&(this_00->super_AStateProvider).super_AInventory)
                             (this_00);
          *(PClass **)((long)&(this_00->super_AStateProvider).super_AInventory + 8) = pPVar8;
        }
        bVar12 = pPVar8 != (PClass *)0x0;
        if (pPVar8 != pPVar6 && bVar12) {
          do {
            pPVar8 = pPVar8->ParentClass;
            bVar12 = pPVar8 != (PClass *)0x0;
            if (pPVar8 == pPVar6) break;
          } while (pPVar8 != (PClass *)0x0);
        }
        if ((bVar12) && (this_00->SelectionOrder <= iVar10)) {
          if (ammotype == (PClassAmmo *)0x0) {
LAB_00467212:
            if (pAVar7 == (AInventory *)0x0) {
              bVar1 = *(undefined1 *)
                       ((long)&(this_00->super_AStateProvider).super_AInventory + 0x4fd);
joined_r0x0046723d:
              if ((bVar1 & 4) != 0) goto LAB_004671c0;
            }
            else {
              TVar4.field_0 =
                   (anon_union_8_2_947301c2_for_TObjPtr<AWeapon>_1)(this_00->SisterWeapon).field_0.p
              ;
              if (TVar4.field_0 != (AWeapon *)0x0) {
                if ((*(byte *)((long)TVar4.field_0 + 0x20) & 0x20) == 0) {
                  bVar1 = *(byte *)((long)TVar4.field_0 + 0x4fd);
                  goto joined_r0x0046723d;
                }
                (this_00->SisterWeapon).field_0.p = (AWeapon *)0x0;
              }
            }
            if (((*(undefined1 *)((long)&(this_00->super_AStateProvider).super_AInventory + 0x4fc) &
                 0x20) != 0) || (bVar12 = AWeapon::CheckAmmo(this_00,0,false,false,-1), bVar12)) {
              if (this_00->MinSelAmmo1 < 1) {
LAB_0046729d:
                if (this_00->MinSelAmmo2 < 1) {
LAB_004672c9:
                  iVar10 = this_00->SelectionOrder;
                  pAVar11 = this_00;
                }
                else {
                  TVar3.field_0 =
                       (anon_union_8_2_947301c2_for_TObjPtr<AAmmo>_1)(this_00->Ammo2).field_0.p;
                  if (TVar3.field_0 != (AAmmo *)0x0) {
                    if ((*(byte *)((long)TVar3.field_0 + 0x20) & 0x20) == 0) {
                      if (this_00->MinSelAmmo2 <= *(int *)((long)TVar3.field_0 + 0x4c8))
                      goto LAB_004672c9;
                    }
                    else {
                      (this_00->Ammo2).field_0.p = (AAmmo *)0x0;
                    }
                  }
                }
              }
              else {
                TVar3.field_0 =
                     (anon_union_8_2_947301c2_for_TObjPtr<AAmmo>_1)(this_00->Ammo1).field_0.p;
                if (TVar3.field_0 != (AAmmo *)0x0) {
                  if ((*(byte *)((long)TVar3.field_0 + 0x20) & 0x20) != 0) goto LAB_004672d7;
                  if (this_00->MinSelAmmo1 <= *(int *)((long)TVar3.field_0 + 0x4c8))
                  goto LAB_0046729d;
                }
              }
            }
          }
          else {
            TVar3.field_0 = (anon_union_8_2_947301c2_for_TObjPtr<AAmmo>_1)(this_00->Ammo1).field_0.p
            ;
            if (TVar3.field_0 != (AAmmo *)0x0) {
              if ((*(byte *)((long)TVar3.field_0 + 0x20) & 0x20) == 0) {
                pPVar9 = *(PClassAmmo **)((long)TVar3.field_0 + 8);
                if (pPVar9 == (PClassAmmo *)0x0) {
                  pPVar9 = (PClassAmmo *)(*(code *)**(undefined8 **)TVar3.field_0)(TVar3.field_0);
                  *(PClassAmmo **)((long)TVar3.field_0 + 8) = pPVar9;
                }
                if (pPVar9 == ammotype) goto LAB_00467212;
              }
              else {
LAB_004672d7:
                (this_00->Ammo1).field_0.p = (AAmmo *)0x0;
              }
            }
          }
        }
LAB_004671c0:
        pAVar2 = (AWeapon *)
                 (this_00->super_AStateProvider).super_AInventory.super_AActor.Inventory.field_0.p;
        if (pAVar2 == (AWeapon *)0x0) {
          return pAVar11;
        }
      } while ((*(byte *)((long)&(pAVar2->super_AStateProvider).super_AInventory.super_AActor.
                                 super_DThinker.super_DObject + 0x20) & 0x20) == 0);
      pAVar5 = &this_00->super_AStateProvider;
    }
    else {
      pAVar5 = (AStateProvider *)&this->super_AActor;
      pAVar11 = (AWeapon *)0x0;
    }
    (((TObjPtr<AInventory> *)((long)&(pAVar5->super_AInventory).super_AActor + 0x3b0))->field_0).p =
         (AInventory *)0x0;
  }
  return pAVar11;
}

Assistant:

AWeapon *APlayerPawn::BestWeapon(PClassAmmo *ammotype)
{
	AWeapon *bestMatch = NULL;
	int bestOrder = INT_MAX;
	AInventory *item;
	AWeapon *weap;
	bool tomed = NULL != FindInventory (RUNTIME_CLASS(APowerWeaponLevel2), true);

	// Find the best weapon the player has.
	for (item = Inventory; item != NULL; item = item->Inventory)
	{
		if (!item->IsKindOf (RUNTIME_CLASS(AWeapon)))
			continue;

		weap = static_cast<AWeapon *> (item);

		// Don't select it if it's worse than what was already found.
		if (weap->SelectionOrder > bestOrder)
			continue;

		// Don't select it if its primary fire doesn't use the desired ammo.
		if (ammotype != NULL &&
			(weap->Ammo1 == NULL ||
			 weap->Ammo1->GetClass() != ammotype))
			continue;

		// Don't select it if the Tome is active and this isn't the powered-up version.
		if (tomed && weap->SisterWeapon != NULL && weap->SisterWeapon->WeaponFlags & WIF_POWERED_UP)
			continue;

		// Don't select it if it's powered-up and the Tome is not active.
		if (!tomed && weap->WeaponFlags & WIF_POWERED_UP)
			continue;

		// Don't select it if there isn't enough ammo to use its primary fire.
		if (!(weap->WeaponFlags & WIF_AMMO_OPTIONAL) &&
			!weap->CheckAmmo (AWeapon::PrimaryFire, false))
			continue;

		// Don't select if if there isn't enough ammo as determined by the weapon's author.
		if (weap->MinSelAmmo1 > 0 && (weap->Ammo1 == NULL || weap->Ammo1->Amount < weap->MinSelAmmo1))
			continue;
		if (weap->MinSelAmmo2 > 0 && (weap->Ammo2 == NULL || weap->Ammo2->Amount < weap->MinSelAmmo2))
			continue;

		// This weapon is usable!
		bestOrder = weap->SelectionOrder;
		bestMatch = weap;
	}
	return bestMatch;
}